

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

CATNClosure * __thiscall
Centaurus::CompositeATN<char>::build_root_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<char> *this,ATNPath *path)

{
  _Rb_tree_header *p_Var1;
  pointer pNVar2;
  CATNNode<char> *pCVar3;
  ulong uVar4;
  int color;
  ATNPath local_b0;
  ATNStateStack stack;
  vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_> local_70
  ;
  Identifier local_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack._vptr_ATNPath = (_func_int **)&PTR__ATNPath_001b1f40;
  pCVar3 = get_node(this,path);
  color = 1;
  while( true ) {
    pNVar2 = (pCVar3->m_transitions).
             super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (ulong)(color - 1);
    if ((ulong)(((long)(pCVar3->m_transitions).
                       super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) / 0x38) <= uVar4)
    {
      std::
      vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ::~vector(&stack.
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
      return __return_storage_ptr__;
    }
    if (*(pointer *)
         &pNVar2[uVar4].m_label.m_ranges.
          super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
          _M_impl !=
        *(pointer *)
         ((long)&pNVar2[uVar4].m_label.m_ranges.
                 super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
         + 8)) break;
    ATNPath::replace_index(&local_b0,path,pNVar2[uVar4].m_dest);
    Identifier::Identifier
              (&local_58,
               &(path->
                super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                ).
                super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].first);
    PriorityChain::PriorityChain
              ((PriorityChain *)&local_70,&local_58,
               (path->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].second,
               (pCVar3->m_transitions).
               super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4].m_tag);
    build_closure_inclusive
              (this,__return_storage_ptr__,&local_b0,color,&stack,(PriorityChain *)&local_70);
    std::vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
    ~vector(&local_70);
    Identifier::~Identifier(&local_58);
    std::
    vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
    ::~vector(&local_b0.
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             );
    color = color + 1;
  }
  __assert_fail("transitions[i].is_epsilon()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/tests/../src/core/CompositeATN.hpp"
                ,0x225,
                "CATNClosure Centaurus::CompositeATN<char>::build_root_closure(const ATNPath &) const [TCHAR = char]"
               );
}

Assistant:

CATNClosure build_root_closure(const ATNPath& path) const
    {
        CATNClosure closure;

        ATNStateStack stack;

        const CATNNode<TCHAR>& root_node = get_node(path);

        const std::vector<CATNTransition<TCHAR> >& transitions = root_node.get_transitions();

        for (unsigned int i = 0; i < transitions.size(); i++)
        {
            //All transitions originating from the root node must be epsilon transitions
            assert(transitions[i].is_epsilon());

            build_closure_inclusive(closure, path.replace_index(transitions[i].dest()), i + 1, stack, PriorityChain(path.leaf_id(), path.leaf_index(), transitions[i].tag()));
        }

        return closure;
    }